

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O0

void __thiscall xe::TestSet::removeGroup(TestSet *this,TestGroup *testGroup)

{
  bool bVar1;
  TestGroup *pTVar2;
  TestGroup *local_38;
  _Self local_30;
  TestGroup *local_28;
  _Self local_20;
  TestGroup *local_18;
  TestGroup *testGroup_local;
  TestSet *this_local;
  
  local_28 = testGroup;
  local_18 = testGroup;
  testGroup_local = (TestGroup *)this;
  local_20._M_node =
       (_Base_ptr)
       std::
       set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
       ::find(&this->m_set,(key_type *)&local_28);
  local_30._M_node =
       (_Base_ptr)
       std::
       set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
       ::end(&this->m_set);
  bVar1 = std::operator!=(&local_20,&local_30);
  if (bVar1) {
    local_38 = local_18;
    std::
    set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
    ::erase(&this->m_set,(key_type *)&local_38);
    removeChildren(&this->m_set,local_18);
    pTVar2 = TestNode::getParent(&local_18->super_TestNode);
    if (pTVar2 != (TestGroup *)0x0) {
      pTVar2 = TestNode::getParent(&local_18->super_TestNode);
      removeEmptyGroups(&this->m_set,pTVar2);
    }
  }
  return;
}

Assistant:

void TestSet::removeGroup (const TestGroup* testGroup)
{
	if (m_set.find(testGroup) != m_set.end())
	{
		m_set.erase(testGroup);
		removeChildren(m_set, testGroup);
		if (testGroup->getParent() != DE_NULL)
			removeEmptyGroups(m_set, testGroup->getParent());
	}
}